

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int message_get_body_amqp_data_in_place(MESSAGE_HANDLE message,size_t index,BINARY_DATA *amqp_data)

{
  BODY_AMQP_DATA *pBVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (message == (MESSAGE_HANDLE)0x0 || amqp_data == (BINARY_DATA *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x458;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x458;
    }
    pcVar5 = "Bad arguments: message = %p, amqp_data = %p";
    iVar3 = 0x457;
  }
  else {
    if ((message->body_amqp_value != (AMQP_VALUE)0x0) || (message->body_amqp_data_count == 0)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x461;
      }
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_get_body_amqp_data_in_place",0x460,1,"Body type is not AMQP data");
      return 0x461;
    }
    if (index < message->body_amqp_data_count) {
      pBVar1 = message->body_amqp_data_items;
      amqp_data->bytes = pBVar1[index].body_data_section_bytes;
      amqp_data->length = pBVar1[index].body_data_section_length;
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x468;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x468;
    }
    pcVar5 = "Index too high for AMQP data (%lu), number of AMQP data entries is %lu";
    iVar3 = 0x467;
    amqp_data = (BINARY_DATA *)message->body_amqp_data_count;
    message = (MESSAGE_HANDLE)index;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c",
            "message_get_body_amqp_data_in_place",iVar3,1,pcVar5,message,amqp_data);
  return iVar4;
}

Assistant:

int message_get_body_amqp_data_in_place(MESSAGE_HANDLE message, size_t index, BINARY_DATA* amqp_data)
{
    int result;

    if ((message == NULL) ||
        (amqp_data == NULL))
    {
        /* Codes_SRS_MESSAGE_01_094: [ If `message` or `amqp_data` is NULL, `message_get_body_amqp_data_in_place` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, amqp_data = %p",
            message, amqp_data);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if (body_type != MESSAGE_BODY_TYPE_DATA)
        {
            /* Codes_SRS_MESSAGE_01_096: [ If the body for `message` is not of type `MESSAGE_BODY_TYPE_DATA`, `message_get_body_amqp_data_in_place` shall fail and return a non-zero value. ]*/
            LogError("Body type is not AMQP data");
            result = MU_FAILURE;
        }
        else if (index >= message->body_amqp_data_count)
        {
            /* Codes_SRS_MESSAGE_01_095: [ If `index` indicates an AMQP data entry that is out of bounds, `message_get_body_amqp_data_in_place` shall fail and return a non-zero value. ]*/
            LogError("Index too high for AMQP data (%lu), number of AMQP data entries is %lu",
                (unsigned long)index, (unsigned long)message->body_amqp_data_count);
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_092: [ `message_get_body_amqp_data_in_place` shall place the contents of the `index`th AMQP data for the message instance identified by `message` into the argument `amqp_data`, without copying the binary payload memory. ]*/
            amqp_data->bytes = message->body_amqp_data_items[index].body_data_section_bytes;
            amqp_data->length = message->body_amqp_data_items[index].body_data_section_length;

            /* Codes_SRS_MESSAGE_01_093: [ On success, `message_get_body_amqp_data_in_place` shall return 0. ]*/
            result = 0;
        }
    }

    return result;
}